

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O0

size_t mspace_bulk_free(mspace msp,void **array,size_t nelem)

{
  size_t sVar1;
  size_t nelem_local;
  void **array_local;
  mspace msp_local;
  
  sVar1 = internal_bulk_free((mstate)msp,array,nelem);
  return sVar1;
}

Assistant:

size_t mspace_bulk_free(mspace msp, void* array[], size_t nelem) {
  return internal_bulk_free((mstate)msp, array, nelem);
}